

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# policy.cc
# Opt level: O0

X509_POLICY_NODE * x509_policy_level_find(X509_POLICY_LEVEL *level,ASN1_OBJECT *policy)

{
  int iVar1;
  size_t local_40;
  size_t idx;
  X509_POLICY_NODE node;
  ASN1_OBJECT *policy_local;
  X509_POLICY_LEVEL *level_local;
  
  node._16_8_ = policy;
  iVar1 = sk_X509_POLICY_NODE_is_sorted(level->nodes);
  if (iVar1 != 0) {
    idx._0_4_ = node.mapped;
    idx._4_4_ = node.reachable;
    iVar1 = sk_X509_POLICY_NODE_find(level->nodes,&local_40,(X509_POLICY_NODE *)&idx);
    if (iVar1 == 0) {
      level_local = (X509_POLICY_LEVEL *)0x0;
    }
    else {
      level_local = (X509_POLICY_LEVEL *)sk_X509_POLICY_NODE_value(level->nodes,local_40);
    }
    return (X509_POLICY_NODE *)level_local;
  }
  __assert_fail("sk_X509_POLICY_NODE_is_sorted(level->nodes)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/policy.cc"
                ,0xa4,
                "X509_POLICY_NODE *x509_policy_level_find(X509_POLICY_LEVEL *, const ASN1_OBJECT *)"
               );
}

Assistant:

static X509_POLICY_NODE *x509_policy_level_find(X509_POLICY_LEVEL *level,
                                                const ASN1_OBJECT *policy) {
  assert(sk_X509_POLICY_NODE_is_sorted(level->nodes));
  X509_POLICY_NODE node;
  node.policy = (ASN1_OBJECT *)policy;
  size_t idx;
  if (!sk_X509_POLICY_NODE_find(level->nodes, &idx, &node)) {
    return NULL;
  }
  return sk_X509_POLICY_NODE_value(level->nodes, idx);
}